

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

string * __thiscall
Database::getLatestEntry_abi_cxx11_(string *__return_storage_ptr__,Database *this)

{
  bool bVar1;
  ulong uVar2;
  allocator<char> local_69;
  string *local_68;
  string *line;
  iterator __end1;
  iterator __begin1;
  Database *__range1;
  Database *this_local;
  
  begin((iterator *)&__end1.lines_end,this);
  end((iterator *)&line,this);
  while( true ) {
    bVar1 = iterator::operator!=((iterator *)&__end1.lines_end,(iterator *)&line);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_69);
      std::allocator<char>::~allocator(&local_69);
      return __return_storage_ptr__;
    }
    local_68 = iterator::operator*[abi_cxx11_((iterator *)&__end1.lines_end);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) break;
    iterator::operator++((iterator *)&__end1.lines_end);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string Database::getLatestEntry ()
{
  for (auto& line : *this)
  {
    if (! line.empty ())
    {
      return line;
    }
  }

  return "";
}